

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CullingTestInstance *this)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  deUint32 width;
  VkPrimitiveTopology VVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  CullingTestInstance *this_00;
  TestStatus *pTVar7;
  bool bVar8;
  Vec4 *v0;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  pointer pVVar9;
  NotSupportedError *this_01;
  pointer pVVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  bool bVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  Random rnd;
  IVec4 colorBits;
  VkPhysicalDeviceFeatures deviceFeatures;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_358;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_338;
  CullingTestInstance *local_320;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_318;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  local_2f8;
  RasterizationArguments local_2d8;
  Surface local_2c0;
  undefined1 local_2a8 [8];
  pointer pSStack_2a0;
  pointer local_298;
  ulong uStack_290;
  float local_288 [16];
  bool local_248;
  bool local_247;
  bool local_246;
  ios_base local_230 [264];
  TestStatus *local_128;
  tcu local_120 [8];
  int local_118;
  VkPhysicalDeviceFeatures local_10c;
  
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_2c0,width,width);
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vk = Context::getInstanceInterface
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures(&local_10c,vk,physicalDevice);
  if ((local_10c.fillModeNonSolid != 0) || (1 < this->m_polygonMode - VK_POLYGON_MODE_LINE)) {
    deRandom_init((deRandom *)local_2a8,0x849ea);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&local_338,6);
    if (0 < (int)((ulong)((long)local_338.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_338.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        fVar21 = deRandom_getFloat((deRandom *)local_2a8);
        *(float *)((long)(local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16) =
             fVar21 * 1.8 + -0.9;
        fVar21 = deRandom_getFloat((deRandom *)local_2a8);
        *(float *)((long)(local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + 4) =
             fVar21 * 1.8 + -0.9;
        *(undefined8 *)
         ((long)(local_338.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar16 + 8) =
             0x3f80000000000000;
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x10;
      } while (lVar17 < (int)((ulong)((long)local_338.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_338.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    local_320 = this;
    local_128 = __return_storage_ptr__;
    if (this->m_cullMode != 3) {
      bVar8 = (this->m_cullMode == 1) != (this->m_frontFace == VK_FRONT_FACE_COUNTER_CLOCKWISE);
      VVar4 = this->m_primitiveTopology;
      if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        if (0 < (int)((ulong)((long)local_338.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_338.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
          iVar18 = 0;
          pVVar9 = local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar10 = local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            iVar11 = iVar18 + 2;
            auVar27._4_4_ = pVVar9[iVar18].m_data[0];
            auVar27._0_4_ = pVVar9[(long)iVar18 + 1].m_data[0];
            auVar27._8_8_ = 0;
            auVar23._4_4_ = pVVar9[iVar18].m_data[3];
            auVar23._0_4_ = pVVar9[(long)iVar18 + 1].m_data[3];
            auVar23._8_8_ = 0;
            auVar23 = divps(auVar27,auVar23);
            auVar31._4_4_ = pVVar9[iVar18].m_data[1];
            auVar31._0_4_ = pVVar9[iVar11].m_data[1];
            auVar31._8_8_ = 0;
            auVar29._4_4_ = pVVar9[iVar18].m_data[3];
            auVar29._0_4_ = pVVar9[iVar11].m_data[3];
            auVar29._8_8_ = 0;
            auVar29 = divps(auVar31,auVar29);
            if (bVar8 != 0.0 < (auVar29._0_4_ - auVar29._4_4_) * (auVar23._0_4_ - auVar23._4_4_) -
                               (pVVar9[(long)iVar18 + 1].m_data[1] /
                                pVVar9[(long)iVar18 + 1].m_data[3] - auVar29._4_4_) *
                               (pVVar9[iVar11].m_data[0] / pVVar9[iVar11].m_data[3] - auVar23._4_4_)
               ) {
              local_288[0xc] = 0.0;
              local_288[0xd] = 0.0;
              local_288[0xe] = 0.0;
              local_288[0xf] = 0.0;
              local_288[8] = 0.0;
              local_288[9] = 0.0;
              local_288[10] = 0.0;
              local_288[0xb] = 0.0;
              local_288[4] = 0.0;
              local_288[5] = 0.0;
              local_288[6] = 0.0;
              local_288[7] = 0.0;
              local_2a8 = *(undefined1 (*) [8])pVVar9[iVar18].m_data;
              pSStack_2a0 = *(pointer *)(pVVar9[iVar18].m_data + 2);
              local_248 = false;
              local_298 = *(pointer *)pVVar9[(long)iVar18 + 1].m_data;
              uStack_290 = *(ulong *)(pVVar9[(long)iVar18 + 1].m_data + 2);
              local_247 = false;
              local_288._0_8_ = *(undefined8 *)pVVar9[iVar11].m_data;
              local_288._8_8_ = *(undefined8 *)(pVVar9[iVar11].m_data + 2);
              local_246 = false;
              std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::push_back(&local_358,(value_type *)local_2a8);
              pVVar9 = local_338.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pVVar10 = local_338.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            iVar18 = iVar18 + 3;
          } while (iVar18 < (int)((ulong)((long)pVVar10 - (long)pVVar9) >> 4) + -2);
        }
      }
      else if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        if (0 < (int)((ulong)((long)local_338.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_338.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
          lVar20 = 0x200000000;
          lVar16 = 0;
          lVar17 = 0;
          pVVar9 = local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar10 = local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            lVar13 = lVar20 >> 0x1c;
            fVar21 = *(float *)((long)pVVar9[1].m_data + lVar16 + 0xc);
            uVar3 = *(undefined4 *)((long)pVVar9->m_data + lVar16 + 0xc);
            auVar26._4_4_ = *(undefined4 *)((long)pVVar9->m_data + lVar16);
            auVar26._0_4_ = *(undefined4 *)((long)pVVar9[1].m_data + lVar16);
            auVar26._8_8_ = 0;
            auVar6._4_4_ = uVar3;
            auVar6._0_4_ = fVar21;
            auVar6._8_8_ = 0;
            auVar23 = divps(auVar26,auVar6);
            fVar2 = *(float *)((long)pVVar9->m_data + lVar13 + 0xc);
            auVar30._4_4_ = *(undefined4 *)((long)pVVar9->m_data + lVar16 + 4);
            auVar30._0_4_ = *(undefined4 *)((long)pVVar9->m_data + lVar13 + 4);
            auVar30._8_8_ = 0;
            auVar24._4_4_ = uVar3;
            auVar24._0_4_ = fVar2;
            auVar24._8_8_ = 0;
            auVar29 = divps(auVar30,auVar24);
            if (((uint)lVar17 & 1 ^ (uint)bVar8) !=
                (uint)(0.0 < (auVar29._0_4_ - auVar29._4_4_) * (auVar23._0_4_ - auVar23._4_4_) -
                             (*(float *)((long)pVVar9[1].m_data + lVar16 + 4) / fVar21 -
                             auVar29._4_4_) *
                             (*(float *)((long)pVVar9->m_data + lVar13) / fVar2 - auVar23._4_4_))) {
              puVar1 = (undefined8 *)((long)pVVar9->m_data + lVar16);
              pfVar14 = (float *)((long)pVVar9->m_data + lVar13);
              local_288[0xc] = 0.0;
              local_288[0xd] = 0.0;
              local_288[0xe] = 0.0;
              local_288[0xf] = 0.0;
              local_288[8] = 0.0;
              local_288[9] = 0.0;
              local_288[10] = 0.0;
              local_288[0xb] = 0.0;
              local_288[4] = 0.0;
              local_288[5] = 0.0;
              local_288[6] = 0.0;
              local_288[7] = 0.0;
              local_2a8 = (undefined1  [8])*puVar1;
              pSStack_2a0 = (pointer)puVar1[1];
              local_248 = false;
              local_298 = *(pointer *)((long)pVVar9[1].m_data + lVar16);
              uStack_290 = *(ulong *)((long)pVVar9[1].m_data + lVar16 + 8);
              local_247 = false;
              local_288._0_8_ = *(undefined8 *)pfVar14;
              local_288._8_8_ = *(undefined8 *)(pfVar14 + 2);
              local_246 = false;
              std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::push_back(&local_358,(value_type *)local_2a8);
              pVVar9 = local_338.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pVVar10 = local_338.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            lVar17 = lVar17 + 1;
            lVar20 = lVar20 + 0x100000000;
            lVar16 = lVar16 + 0x10;
          } while (lVar17 < ((long)pVVar10 - (long)pVVar9) * 0x10000000 + -0x200000000 >> 0x20);
        }
      }
      else if ((VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) &&
              (1 < (int)((ulong)((long)local_338.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_338.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
        lVar16 = 1;
        lVar17 = 0x10;
        pVVar9 = local_338.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar10 = local_338.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          fVar21 = *(float *)((long)pVVar9->m_data + lVar17 + 0xc);
          auVar22._4_4_ = pVVar9->m_data[0];
          auVar22._0_4_ = *(undefined4 *)((long)pVVar9->m_data + lVar17);
          auVar22._8_8_ = 0;
          auVar5._4_4_ = pVVar9->m_data[3];
          auVar5._0_4_ = fVar21;
          auVar5._8_8_ = 0;
          auVar23 = divps(auVar22,auVar5);
          fVar2 = *(float *)((long)pVVar9[1].m_data + lVar17 + 0xc);
          auVar28._4_4_ = pVVar9->m_data[1];
          auVar28._0_4_ = *(undefined4 *)((long)pVVar9[1].m_data + lVar17 + 4);
          auVar28._8_8_ = 0;
          auVar25._4_4_ = pVVar9->m_data[3];
          auVar25._0_4_ = fVar2;
          auVar25._8_8_ = 0;
          auVar29 = divps(auVar28,auVar25);
          if (bVar8 != 0.0 < (auVar29._0_4_ - auVar29._4_4_) * (auVar23._0_4_ - auVar23._4_4_) -
                             (*(float *)((long)pVVar9->m_data + lVar17 + 4) / fVar21 - auVar29._4_4_
                             ) * (*(float *)((long)pVVar9[1].m_data + lVar17) / fVar2 -
                                 auVar23._4_4_)) {
            pfVar14 = (float *)((long)pVVar9->m_data + lVar17);
            local_288[0xc] = 0.0;
            local_288[0xd] = 0.0;
            local_288[0xe] = 0.0;
            local_288[0xf] = 0.0;
            local_288[8] = 0.0;
            local_288[9] = 0.0;
            local_288[10] = 0.0;
            local_288[0xb] = 0.0;
            local_288[4] = 0.0;
            local_288[5] = 0.0;
            local_288[6] = 0.0;
            local_288[7] = 0.0;
            local_2a8 = *(undefined1 (*) [8])pVVar9->m_data;
            pSStack_2a0 = *(pointer *)(pVVar9->m_data + 2);
            local_248 = false;
            local_298 = *(pointer *)pfVar14;
            uStack_290 = *(ulong *)(pfVar14 + 2);
            local_247 = false;
            local_288._0_8_ = *(undefined8 *)((long)pVVar9[1].m_data + lVar17);
            local_288._8_8_ = *(undefined8 *)((long)pVVar9[1].m_data + lVar17 + 8);
            local_246 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_358,(value_type *)local_2a8);
            pVVar9 = local_338.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pVVar10 = local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0x10;
        } while (lVar16 < ((long)pVVar10 - (long)pVVar9) * 0x10000000 + -0x100000000 >> 0x20);
      }
    }
    if (local_320->m_polygonMode == VK_POLYGON_MODE_POINT) {
      if (0 < (int)((ulong)((long)local_358.
                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_358.
                                 super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7) {
        lVar16 = 0;
        uVar19 = 0;
        do {
          lVar17 = 0;
          do {
            local_298 = (pointer)0x0;
            uStack_290 = 0;
            uVar12 = ((long)local_358.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_358.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
            if (uVar12 < uVar19 || uVar12 - uVar19 == 0) goto LAB_007c837d;
            puVar1 = (undefined8 *)
                     ((long)(local_358.
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                     lVar17 + lVar16);
            local_2a8 = (undefined1  [8])*puVar1;
            pSStack_2a0 = (pointer)puVar1[1];
            local_288[0] = 1.0;
            std::
            vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            ::push_back(&local_2f8,(value_type *)local_2a8);
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x30);
          uVar19 = uVar19 + 1;
          lVar16 = lVar16 + 100;
        } while ((long)uVar19 <
                 (long)((int)((ulong)((long)local_358.
                                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_358.
                                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x3d70a3d7));
      }
    }
    else if ((local_320->m_polygonMode == VK_POLYGON_MODE_LINE) &&
            (0 < (int)((ulong)((long)local_358.
                                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_358.
                                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7))
    {
      uVar19 = 0;
      do {
        lVar16 = 0;
        bVar8 = true;
        do {
          bVar15 = bVar8;
          local_288[4] = 0.0;
          local_288[5] = 0.0;
          local_288[6] = 0.0;
          local_288[7] = 0.0;
          local_288[0] = 0.0;
          local_288[1] = 0.0;
          local_288[2] = 0.0;
          local_288[3] = 0.0;
          uVar12 = ((long)local_358.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_358.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
          if (uVar12 < uVar19 || uVar12 - uVar19 == 0) goto LAB_007c837d;
          local_2a8 = *(undefined1 (*) [8])
                       local_358.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[lVar16].m_data;
          pSStack_2a0 = *(pointer *)
                         (local_358.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[lVar16].m_data
                         + 2);
          local_298 = *(pointer *)
                       local_358.
                       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[lVar16 + 1].
                       m_data;
          uStack_290 = *(ulong *)(local_358.
                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar19].positions
                                  [lVar16 + 1].m_data + 2);
          std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::push_back(&local_318,(value_type *)local_2a8);
          lVar16 = 1;
          bVar8 = false;
        } while (bVar15);
        local_288[4] = 0.0;
        local_288[5] = 0.0;
        local_288[6] = 0.0;
        local_288[7] = 0.0;
        local_288[0] = 0.0;
        local_288[1] = 0.0;
        local_288[2] = 0.0;
        local_288[3] = 0.0;
        uVar12 = ((long)local_358.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_358.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
        if (uVar12 < uVar19 || uVar12 - uVar19 == 0) goto LAB_007c837d;
        local_2a8 = *(undefined1 (*) [8])
                     local_358.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[2].m_data;
        pSStack_2a0 = *(pointer *)
                       (local_358.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[2].m_data + 2);
        local_298 = *(pointer *)
                     local_358.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[0].m_data;
        uStack_290 = *(ulong *)(local_358.
                                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[0].
                                m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_318,(value_type *)local_2a8);
        uVar19 = uVar19 + 1;
      } while ((long)uVar19 <
               (long)((int)((ulong)((long)local_358.
                                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_358.
                                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x3d70a3d7));
    }
    this_00 = local_320;
    local_2a8 = (undefined1  [8])
                ((local_320->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_2a0,"Setting front face to ",0x16);
    pTVar7 = local_128;
    local_2d8.redBits = this_00->m_frontFace;
    local_2d8._0_8_ = ::vk::getFrontFaceName;
    tcu::Format::Enum<vk::VkFrontFace,_4UL>::toStream
              ((Enum<vk::VkFrontFace,_4UL> *)&local_2d8,(ostream *)&pSStack_2a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_2a0);
    std::ios_base::~ios_base(local_230);
    local_2a8 = (undefined1  [8])
                ((this_00->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_2a0,"Setting cull face to ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&pSStack_2a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_2a0);
    std::ios_base::~ios_base(local_230);
    local_2a8 = (undefined1  [8])
                ((this_00->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_2a0,"Drawing test pattern (",0x16);
    local_2d8._0_8_ = ::vk::getPrimitiveTopologyName;
    local_2d8.redBits = this_00->m_primitiveTopology;
    tcu::Format::Enum<vk::VkPrimitiveTopology,_4UL>::toStream
              ((Enum<vk::VkPrimitiveTopology,_4UL> *)&local_2d8,(ostream *)&pSStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_2a0,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_2a0);
    std::ios_base::~ios_base(local_230);
    BaseRenderingTestInstance::drawPrimitives
              (&this_00->super_BaseRenderingTestInstance,&local_2c0,&local_338,
               this_00->m_primitiveTopology);
    tcu::getTextureFormatBitDepth
              (local_120,&(this_00->super_BaseRenderingTestInstance).m_textureFormat);
    local_2d8.subpixelBits = (this_00->super_BaseRenderingTestInstance).m_subpixelBits;
    local_2d8.numSamples = (uint)this_00->m_multisampling;
    local_2d8._8_8_ = local_120;
    local_2d8.blueBits = local_118;
    if (this_00->m_polygonMode == VK_POLYGON_MODE_LINE) {
      uStack_290 = uStack_290 & 0xffffffff00000000;
      local_2a8 = (undefined1  [8])
                  local_318.
                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pSStack_2a0 = (pointer)local_318.
                             super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      local_298 = (pointer)local_318.
                           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_318.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = tcu::verifyLineGroupRasterization
                        (&local_2c0,(LineSceneSpec *)local_2a8,&local_2d8,
                         ((this_00->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                         m_testCtx->m_log);
    }
    else if (this_00->m_polygonMode == VK_POLYGON_MODE_POINT) {
      local_2a8 = (undefined1  [8])
                  local_2f8.
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pSStack_2a0 = (pointer)local_2f8.
                             super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      local_298 = (pointer)local_2f8.
                           super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2f8.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2f8.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f8.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = tcu::verifyPointGroupRasterization
                        (&local_2c0,(PointSceneSpec *)local_2a8,&local_2d8,
                         ((this_00->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                         m_testCtx->m_log);
    }
    else {
      local_2a8 = (undefined1  [8])
                  local_358.
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pSStack_2a0 = local_358.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_298 = local_358.
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_358.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = tcu::verifyTriangleGroupRasterization
                        (&local_2c0,(TriangleSceneSpec *)local_2a8,&local_2d8,
                         ((this_00->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                         m_testCtx->m_log,VERIFICATIONMODE_WEAK);
    }
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8,(long)local_298 - (long)local_2a8);
    }
    local_2a8 = (undefined1  [8])&local_298;
    if (bVar8 == false) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Incorrect rendering","");
      pTVar7->m_code = QP_TEST_RESULT_FAIL;
      (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar7->m_description,local_2a8,
                 (long)pSStack_2a0->positions[0].m_data + (long)((Vec4 *)local_2a8)->m_data);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Pass","");
      pTVar7->m_code = QP_TEST_RESULT_PASS;
      (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar7->m_description,local_2a8,
                 (long)pSStack_2a0->positions[0].m_data + (long)((Vec4 *)local_2a8)->m_data);
    }
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8,(ulong)((long)local_298->positions[0].m_data + 1));
    }
    if ((pointer)local_318.
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_2f8.
                 super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.
                      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f8.
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_358.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_358.
                      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_358.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_358.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_338.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_338.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_2c0);
    return pTVar7;
  }
LAB_007c838e:
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Wireframe fill modes are not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
             ,0x80c);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
LAB_007c837d:
  uStack_290 = 0;
  local_298 = (pointer)0x0;
  pSStack_2a0 = (pointer)0x0;
  local_2a8 = (undefined1  [8])0x0;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19);
  goto LAB_007c838e;
}

Assistant:

tcu::TestStatus CullingTestInstance::iterate (void)
{
	DE_ASSERT(m_polygonMode < VK_POLYGON_MODE_LAST);

	tcu::Surface									resultImage						(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;
	std::vector<PointSceneSpec::ScenePoint>			points;
	std::vector<LineSceneSpec::SceneLine>			lines;

	const InstanceInterface&						vk				= m_context.getInstanceInterface();
	const VkPhysicalDevice							physicalDevice	= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures					deviceFeatures	= getPhysicalDeviceFeatures(vk, physicalDevice);

	if (!(deviceFeatures.fillModeNonSolid) && (m_polygonMode == VK_POLYGON_MODE_LINE || m_polygonMode == VK_POLYGON_MODE_POINT))
		TCU_THROW(NotSupportedError, "Wireframe fill modes are not supported");

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	if (m_polygonMode == VK_POLYGON_MODE_LINE)
		extractLines(triangles ,lines);
	else if (m_polygonMode == VK_POLYGON_MODE_POINT)
		extractPoints(triangles, points);

	// draw image
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting front face to " << m_frontFace << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting cull face to " << m_cullMode << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing test pattern (" << m_primitiveTopology << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);
	}

	// compare
	{
		RasterizationArguments	args;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());
		bool					isCompareOk	= false;

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		switch (m_polygonMode)
		{
			case VK_POLYGON_MODE_LINE:
			{
				LineSceneSpec scene;
				scene.lineWidth = 0;
				scene.lines.swap(lines);
				isCompareOk = verifyLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			case VK_POLYGON_MODE_POINT:
			{
				PointSceneSpec scene;
				scene.points.swap(points);
				isCompareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			default:
			{
				TriangleSceneSpec scene;
				scene.triangles.swap(triangles);
				isCompareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog(), tcu::VERIFICATIONMODE_WEAK);
				break;
			}
		}

		if (isCompareOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rendering");
	}
}